

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

void lzma_decoder_reset(lzma_coder_conflict8 *coder,void *opt)

{
  undefined4 uVar1;
  uint local_50;
  uint local_4c;
  uint32_t bt_i_7;
  uint32_t bt_i_6;
  uint32_t bt_i_5;
  uint32_t bt_i_4;
  uint32_t bt_i_3;
  uint32_t bt_i_2;
  uint32_t bt_i_1;
  uint32_t bt_i;
  lzma_options_lzma *options;
  uint32_t num_pos_states;
  uint32_t pos_state;
  uint32_t j;
  uint32_t i;
  void *opt_local;
  lzma_coder_conflict8 *coder_local;
  
  coder->pos_mask = (1 << ((byte)*(undefined4 *)((long)opt + 0x1c) & 0x1f)) - 1;
  literal_init((probability (*) [768])coder,*(uint32_t *)((long)opt + 0x14),
               *(uint32_t *)((long)opt + 0x18));
  coder->literal_context_bits = *(uint32_t *)((long)opt + 0x14);
  coder->literal_pos_mask = (1 << ((byte)*(undefined4 *)((long)opt + 0x18) & 0x1f)) - 1;
  coder->state = STATE_LIT_LIT;
  coder->rep0 = 0;
  coder->rep1 = 0;
  coder->rep2 = 0;
  coder->rep3 = 0;
  coder->pos_mask = (1 << ((byte)*(undefined4 *)((long)opt + 0x1c) & 0x1f)) - 1;
  (coder->rc).range = 0xffffffff;
  (coder->rc).code = 0;
  (coder->rc).init_bytes_left = 5;
  for (pos_state = 0; pos_state < 0xc; pos_state = pos_state + 1) {
    for (num_pos_states = 0; num_pos_states <= coder->pos_mask; num_pos_states = num_pos_states + 1)
    {
      coder->is_match[pos_state][num_pos_states] = 0x400;
      coder->is_rep0_long[pos_state][num_pos_states] = 0x400;
    }
    coder->is_rep[pos_state] = 0x400;
    coder->is_rep0[pos_state] = 0x400;
    coder->is_rep1[pos_state] = 0x400;
    coder->is_rep2[pos_state] = 0x400;
  }
  for (pos_state = 0; pos_state < 4; pos_state = pos_state + 1) {
    for (bt_i_2 = 0; bt_i_2 < 0x40; bt_i_2 = bt_i_2 + 1) {
      coder->pos_slot[pos_state][bt_i_2] = 0x400;
    }
  }
  for (pos_state = 0; pos_state < 0x72; pos_state = pos_state + 1) {
    coder->pos_special[pos_state] = 0x400;
  }
  for (bt_i_3 = 0; bt_i_3 < 0x10; bt_i_3 = bt_i_3 + 1) {
    coder->pos_align[bt_i_3] = 0x400;
  }
  uVar1 = *(undefined4 *)((long)opt + 0x1c);
  (coder->match_len_decoder).choice = 0x400;
  (coder->match_len_decoder).choice2 = 0x400;
  (coder->rep_len_decoder).choice = 0x400;
  (coder->rep_len_decoder).choice2 = 0x400;
  for (options._4_4_ = 0; options._4_4_ < (uint)(1 << ((byte)uVar1 & 0x1f));
      options._4_4_ = options._4_4_ + 1) {
    for (bt_i_4 = 0; bt_i_4 < 8; bt_i_4 = bt_i_4 + 1) {
      (coder->match_len_decoder).low[options._4_4_][bt_i_4] = 0x400;
    }
    for (bt_i_5 = 0; bt_i_5 < 8; bt_i_5 = bt_i_5 + 1) {
      (coder->match_len_decoder).mid[options._4_4_][bt_i_5] = 0x400;
    }
    for (bt_i_6 = 0; bt_i_6 < 8; bt_i_6 = bt_i_6 + 1) {
      (coder->rep_len_decoder).low[options._4_4_][bt_i_6] = 0x400;
    }
    for (bt_i_7 = 0; bt_i_7 < 8; bt_i_7 = bt_i_7 + 1) {
      (coder->rep_len_decoder).mid[options._4_4_][bt_i_7] = 0x400;
    }
  }
  for (local_4c = 0; local_4c < 0x100; local_4c = local_4c + 1) {
    (coder->match_len_decoder).high[local_4c] = 0x400;
  }
  for (local_50 = 0; local_50 < 0x100; local_50 = local_50 + 1) {
    (coder->rep_len_decoder).high[local_50] = 0x400;
  }
  coder->sequence = SEQ_BLOCK_HEADER;
  coder->probs = (probability *)0x0;
  coder->symbol = 0;
  coder->limit = 0;
  coder->offset = 0;
  coder->len = 0;
  return;
}

Assistant:

static void
lzma_decoder_reset(lzma_coder *coder, const void *opt)
{
	uint32_t i, j, pos_state;
	uint32_t num_pos_states;

	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}